

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Status_c2f(MPIABI_Status *c_status,MPIABI_Fint *f_status)

{
  int iVar1;
  MPI_Status *mpi_status_ptr;
  
  iVar1 = MPI_Status_c2f();
  if (c_status != (MPIABI_Status *)0x0) {
    c_status->MPI_SOURCE = (int)*(undefined8 *)&c_status->mpi_status;
    c_status->MPI_TAG = (int)((ulong)*(undefined8 *)&c_status->mpi_status >> 0x20);
    c_status->MPI_ERROR = (c_status->mpi_status).status_OpenMPI.f2;
  }
  return iVar1;
}

Assistant:

int MPIABI_Status_c2f(
  const MPIABI_Status * c_status,
  MPIABI_Fint * f_status
) {
  return MPI_Status_c2f(
    (const MPI_Status *)(WPI_const_StatusPtr)c_status,
    (MPI_Fint *)(WPI_Fint *)f_status
  );
}